

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O0

error<idx2::idx2_err_code> idx2::ParallelDecode(idx2_file *Idx2,params *P,buffer *OutBuf)

{
  long lVar1;
  cstr pcVar2;
  cstr pcVar3;
  allocator *Alloc;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar4;
  error<idx2::err_code> eVar5;
  cstr local_760;
  undefined6 local_730;
  undefined2 uStack_72a;
  err_code local_728;
  i8 iStack_724;
  bool bStack_723;
  anon_class_1_0_00000001 local_719;
  error<idx2::err_code> local_718;
  error<idx2::idx2_err_code> local_708;
  decode_data *local_6f8;
  undefined1 local_6f0 [8];
  unique_lock<std::mutex> Lock;
  undefined1 local_6d0 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:520:3)>
  __ScopeGuard__520;
  anon_class_8_1_54a397e4_for_Func __CleanUpFunc__520;
  decode_data D;
  int BrickBytes;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_414;
  int local_40c;
  error<idx2::mmap_err_code> local_408;
  cstr local_3f8;
  cstr OutFile;
  int local_3e8;
  cstr local_3e0;
  int local_3d8;
  undefined1 auStack_3c8 [8];
  metadata Met;
  undefined1 local_330 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:493:3)>
  __ScopeGuard__493;
  anon_class_16_2_dba2fc88_for_Func __CleanUpFunc__493;
  volume OutVolMem;
  undefined1 local_2d8 [8];
  mmap_volume OutVolFile;
  grid OutGrid;
  timer DecodeTimer;
  buffer *OutBuf_local;
  params *P_local;
  idx2_file *Idx2_local;
  v3i *local_238;
  u64 *local_230;
  undefined8 local_228;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_220;
  undefined4 local_218;
  undefined8 local_210;
  int local_208;
  allocator **local_200;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_1f8;
  int local_1f0;
  cstr local_1e8;
  int local_1e0;
  cstr local_1d8;
  int local_1d0;
  allocator **local_1c8;
  cstr local_1c0;
  int local_1b8;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_1b0;
  mmap_volume **local_1a8;
  long local_190;
  undefined1 local_188 [8];
  timespec End;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_8;
  memory_order __b_7;
  undefined8 local_78;
  int local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_58;
  int local_50;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_40;
  int local_34;
  int local_30;
  int local_2c;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_28;
  mallocator *local_20;
  mmap_volume **local_18;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_10;
  
  local_230 = &OutGrid.Strd;
  clock_gettime(1,(timespec *)local_230);
  GetGrid((grid *)&OutVolFile.MMap.Buf.Alloc,Idx2,&P->DecodeExtent);
  mmap_volume::mmap_volume((mmap_volume *)local_2d8);
  local_228 = &__CleanUpFunc__493.OutVolFile;
  local_20 = Mallocator();
  __CleanUpFunc__493.OutVolFile = (mmap_volume *)0x0;
  __CleanUpFunc__493.P = (params *)local_2d8;
  __ScopeGuard__493._16_8_ = P;
  local_18 = &__CleanUpFunc__493.OutVolFile;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:493:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:493:3)>
                 *)local_330,(anon_class_16_2_dba2fc88_for_Func *)&__ScopeGuard__493.Dismissed);
  if (P->OutMode == RegularGridFile) {
    metadata::metadata((metadata *)auStack_3c8);
    auStack_3c8 = *(undefined1 (*) [8])Idx2->Name;
    Met.Name._0_8_ = *(undefined8 *)(Idx2->Name + 8);
    Met.Name._8_8_ = *(undefined8 *)(Idx2->Name + 0x10);
    Met.Name._16_8_ = *(undefined8 *)(Idx2->Name + 0x18);
    Met.Name._24_8_ = *(undefined8 *)(Idx2->Name + 0x20);
    Met.Name._32_8_ = *(undefined8 *)(Idx2->Name + 0x28);
    Met.Name._40_8_ = *(undefined8 *)(Idx2->Name + 0x30);
    Met.Name._48_8_ = *(undefined8 *)(Idx2->Name + 0x38);
    Met.Name._56_8_ = *(undefined8 *)Idx2->Field;
    Met.Field._0_8_ = *(undefined8 *)(Idx2->Field + 8);
    Met.Field._8_8_ = *(undefined8 *)(Idx2->Field + 0x10);
    Met.Field._16_8_ = *(undefined8 *)(Idx2->Field + 0x18);
    Met.Field._24_8_ = *(undefined8 *)(Idx2->Field + 0x20);
    Met.Field._32_8_ = *(undefined8 *)(Idx2->Field + 0x28);
    Met.Field._40_8_ = *(undefined8 *)(Idx2->Field + 0x30);
    Met.Field._48_8_ = *(undefined8 *)(Idx2->Field + 0x38);
    local_1c8 = &OutVolFile.MMap.Buf.Alloc;
    local_64 = ((int)OutGrid.super_extent.From << 0xb) >> 0xb;
    local_60 = &local_78;
    local_68 = (int)((long)(OutGrid.super_extent.From << 0x16) >> 0x2b);
    local_3e8 = (int)((long)(OutGrid.super_extent.From * 2) >> 0x2b);
    local_78._0_4_ = local_64;
    local_78._4_4_ = local_68;
    local_1d8 = local_78;
    local_1c0 = local_78;
    local_1e8 = local_78;
    OutFile = local_78;
    local_3e0 = local_78;
    Met.Field._56_8_ = local_78;
    Met.Dims3.field_0.field_0.Y._0_1_ = Idx2->DType;
    local_3d8 = local_3e8;
    Met.Dims3.field_0.field_0.X = local_3e8;
    local_1e0 = local_3e8;
    local_1d0 = local_3e8;
    local_1b8 = local_3e8;
    local_6c = local_3e8;
    if (P->OutFile == (cstr)0x0) {
      lVar1 = *in_FS_OFFSET;
      pcVar2 = P->OutDir;
      pcVar3 = ToRawFileName((metadata *)auStack_3c8);
      snprintf((char *)(lVar1 + -0xf80),0x400,"%s/%s-tolerance-%f.raw",P->DecodeTolerance,pcVar2,
               pcVar3);
      lVar1 = *in_FS_OFFSET;
    }
    else {
      snprintf((char *)(*in_FS_OFFSET + -0xf80),0x400,"%s/%s",P->OutDir,P->OutFile);
      lVar1 = *in_FS_OFFSET;
    }
    local_760 = (cstr)(lVar1 + -0xf80);
    local_3f8 = local_760;
    local_408 = MapVolume(local_760,(v3i *)(Met.Field + 0x38),Met.Dims3.field_0.field_0.Y._0_1_,
                          (mmap_volume *)local_2d8,Write);
    printf("writing output volume to %s\n",local_3f8);
  }
  else {
    if (P->OutMode == RegularGridMem) {
      __CleanUpFunc__493.OutVolFile = (mmap_volume *)OutBuf->Data;
      local_200 = &OutVolFile.MMap.Buf.Alloc;
      local_2c = ((int)OutGrid.super_extent.From << 0xb) >> 0xb;
      local_28 = &local_40;
      local_30 = (int)((long)(OutGrid.super_extent.From << 0x16) >> 0x2b);
      local_40c = (int)((long)(OutGrid.super_extent.From * 2) >> 0x2b);
      local_40.field_0.X = local_2c;
      local_40.field_0.Y = local_30;
      local_58 = local_40;
      local_210 = local_40;
      local_1f8 = local_40;
      local_220 = local_40;
      local_414 = local_40;
      local_1a8 = &__CleanUpFunc__493.OutVolFile;
      local_1b0 = &local_414;
      local_218 = local_40c;
      local_208 = local_40c;
      local_1f0 = local_40c;
      local_50 = local_40c;
      local_34 = local_40c;
      local_10 = local_1b0;
    }
  }
  local_238 = &Idx2->BrickDimsExt3;
  D.NInsignificantSubbands.super___atomic_base<long>._M_i._4_4_ =
       (local_238->field_0).field_0.X * (Idx2->BrickDimsExt3).field_0.field_0.Y *
       (Idx2->BrickDimsExt3).field_0.field_0.Z * 8;
  decode_data::decode_data((decode_data *)&__CleanUpFunc__520);
  __ScopeGuard__520._8_8_ = &__CleanUpFunc__520;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:520:3)>
  ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:520:3)>
                 *)local_6d0,(anon_class_8_1_54a397e4_for_Func *)&__ScopeGuard__520.Dismissed);
  Alloc = &Mallocator()->super_allocator;
  Init((decode_data *)&__CleanUpFunc__520,Idx2,Alloc);
  eVar4 = TraverseFirstLevel(Idx2,P,(decode_data *)&__CleanUpFunc__520,
                             (grid *)&OutVolFile.MMap.Buf.Alloc,(mmap_volume *)local_2d8,
                             (volume *)&__CleanUpFunc__493.OutVolFile);
  Lock._8_8_ = eVar4.Msg;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_6f0,
             (mutex_type *)&D.BrickPoolMutex.super___mutex_base._M_mutex.__data.__list.__next);
  local_6f8 = (decode_data *)&__CleanUpFunc__520;
  std::condition_variable::
  wait<idx2::ParallelDecode(idx2::idx2_file_const&,idx2::params_const&,idx2::buffer*)::__2>
            ((condition_variable *)&D.Mutex.super___mutex_base._M_mutex.__data.__list.__next,
             (unique_lock<std::mutex> *)local_6f0,(anon_class_8_1_54a397e4)local_6f8);
  if (P->OutMode == HashMap) {
    PrintStatistics((brick_pool *)&D.FileCacheTable.Alloc);
    ComputeBrickResolution((brick_pool *)&D.FileCacheTable.Alloc);
    local_708 = WriteBricks((brick_pool *)&D.FileCacheTable.Alloc,"bricks");
  }
  End.tv_nsec = (__syscall_slong_t)&OutGrid.Strd;
  clock_gettime(1,(timespec *)local_188);
  local_190 = (long)((double)((long)local_188 - *(long *)End.tv_nsec) * 1000000000.0 +
                    (double)(End.tv_sec - *(long *)(End.tv_nsec + 8)));
  printf("total decode time   = %f\n",(double)local_190 / 1000000000.0);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("io time             = %f\n",(double)D.NTasks / 1000000000.0);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("data movement time  = %f\n",
         (double)(long)D.BytesDecoded_.super___atomic_base<unsigned_long>._M_i / 1000000000.0);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("exp   bytes read    = %li\n",D.DecodeIOTime_.super___atomic_base<unsigned_long>._M_i);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("data  bytes read    = %li\n",D.BytesExps_.super___atomic_base<unsigned_long>._M_i);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("total bytes read    = %li\n",
         (long)D.DecodeIOTime_.super___atomic_base<unsigned_long>._M_i +
         (long)D.BytesExps_.super___atomic_base<unsigned_long>._M_i);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("total bytes decoded = %li\n",
         (ulong)D.BytesData_.super___atomic_base<unsigned_long>._M_i >> 3);
  printf("final size of brick hashmap = %li\n",D.BrickPool.BrickTable.Stats);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("number of significant blocks = %li\n",
         D.DataMovementTime_.super___atomic_base<unsigned_long>._M_i);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  printf("number of insignificant subbands = %li\n",
         D.NSignificantBlocks.super___atomic_base<long>._M_i);
  eVar5 = ParallelDecode::anon_class_1_0_00000001::operator()(&local_719);
  local_730 = eVar5.Msg._0_6_;
  uStack_72a = eVar5.Msg._6_2_;
  _local_728 = eVar5._8_6_;
  local_718.Code = local_728;
  local_718.StackIdx = iStack_724;
  local_718.StrGened = bStack_723;
  local_718.Msg._0_6_ = local_730;
  local_718.Msg._6_2_ = uStack_72a;
  error<idx2::idx2_err_code>::error<idx2::err_code>
            ((error<idx2::idx2_err_code> *)&Idx2_local,&local_718);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_6f0);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:520:3)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:520:3)>
                  *)local_6d0);
  decode_data::~decode_data((decode_data *)&__CleanUpFunc__520);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:493:3)>
  ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:493:3)>
                  *)local_330);
  return _Idx2_local;
}

Assistant:

error<idx2_err_code>
ParallelDecode(const idx2_file& Idx2, const params& P, buffer* OutBuf)
{
  timer DecodeTimer;
  StartTimer(&DecodeTimer);
  // TODO: we should add a --effective-mask
  grid OutGrid = GetGrid(Idx2, P.DecodeExtent);
  // printf("output grid = " idx2_PrStrGrid "\n", idx2_PrGrid(OutGrid));
  mmap_volume OutVolFile;
  volume OutVolMem;
  idx2_CleanUp(if (P.OutMode == params::out_mode::RegularGridFile) { Unmap(&OutVolFile); });

  if (P.OutMode == params::out_mode::RegularGridFile)
  {
    metadata Met;
    memcpy(Met.Name, Idx2.Name, sizeof(Met.Name));
    memcpy(Met.Field, Idx2.Field, sizeof(Met.Field));
    Met.Dims3 = Dims(OutGrid);
    Met.DType = Idx2.DType;
    //  printf("zfp decode time = %f\n", DecodeTime_);
    cstr OutFile = P.OutFile
                     ? idx2_PrintScratch("%s/%s", P.OutDir, P.OutFile)
                     : idx2_PrintScratch(
                         "%s/%s-tolerance-%f.raw", P.OutDir, ToRawFileName(Met), P.DecodeTolerance);
    //    idx2_RAII(mmap_volume, OutVol, (void)OutVol, Unmap(&OutVol));
    MapVolume(OutFile, Met.Dims3, Met.DType, &OutVolFile, map_mode::Write);
    printf("writing output volume to %s\n", OutFile);
  }
  else if (P.OutMode == params::out_mode::RegularGridMem)
  {
    OutVolMem.Buffer = *OutBuf;
    SetDims(&OutVolMem, Dims(OutGrid));
    OutVolMem.Type = Idx2.DType;
  }

  const int BrickBytes = Prod(Idx2.BrickDimsExt3) * sizeof(f64);
  // for now the allocator seems not a bottleneck
  idx2_RAII(decode_data, D, Init(&D, &Idx2, &Mallocator()));

  TraverseFirstLevel(Idx2, P, &D, OutGrid, &OutVolFile, &OutVolMem);

  std::unique_lock<std::mutex> Lock(D.Mutex);
  D.AllTasksDone.wait(Lock, [&D]{ return D.NTasks == 0; });
  //stlab::pre_exit();

  if (P.OutMode == params::out_mode::HashMap)
  {
    PrintStatistics(&D.BrickPool);
    ComputeBrickResolution(&D.BrickPool);
    WriteBricks(&D.BrickPool, "bricks");
  }

  printf("total decode time   = %f\n", Seconds(ElapsedTime(&DecodeTimer)));
  printf("io time             = %f\n", Seconds(D.DecodeIOTime_.load()));
  printf("data movement time  = %f\n", Seconds(D.DataMovementTime_.load()));
  printf("exp   bytes read    = %" PRIi64 "\n", D.BytesExps_.load());
  printf("data  bytes read    = %" PRIi64 "\n", D.BytesData_.load());
  printf("total bytes read    = %" PRIi64 "\n", D.BytesExps_.load() + D.BytesData_.load());
  printf("total bytes decoded = %" PRIi64 "\n", D.BytesDecoded_.load() / 8);
  printf("final size of brick hashmap = %" PRIi64 "\n", Size(D.BrickPool.BrickTable));
  printf("number of significant blocks = %" PRIi64 "\n", D.NSignificantBlocks.load());
  printf("number of insignificant subbands = %" PRIi64 "\n", D.NInsignificantSubbands.load());

  return idx2_Error(err_code::NoError);
}